

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O0

void __thiscall HDWallet_ConvertTest_Test::TestBody(HDWallet_ConvertTest_Test *this)

{
  bool bVar1;
  reference pBVar2;
  char *pcVar3;
  char *in_R9;
  string local_378;
  AssertHelper local_358;
  Message local_350;
  bool local_341;
  undefined1 local_340 [8];
  AssertionResult gtest_ar__3;
  Message local_328;
  ByteData local_320;
  HDWallet local_308;
  string local_2f0;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_290;
  Message local_288;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__1;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  AssertHelper local_228;
  Message local_220;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_;
  Message local_1f8;
  AssertHelper local_1f0;
  Message local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  AssertHelper local_1c8;
  Message local_1c0;
  ByteData local_1b8;
  AssertHelper local_1a0;
  Message local_198;
  ByteData local_190;
  AssertHelper local_178;
  Message local_170 [2];
  string local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  HDWallet local_128;
  undefined1 local_110 [8];
  Bip39TestVector test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Bip39TestVector,_std::allocator<Bip39TestVector>_> *__range1;
  ByteData copy_seed;
  HDWallet copy_wallet;
  HDWallet hd_wallet;
  bool actual_is_valid;
  undefined1 local_58 [8];
  ByteData actual_seed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  actual_mnemonic;
  ByteData actual_entropy;
  HDWallet_ConvertTest_Test *this_local;
  
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &actual_mnemonic.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&actual_seed.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::ByteData((ByteData *)local_58);
  cfd::core::HDWallet::HDWallet
            ((HDWallet *)
             &copy_wallet.seed_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::HDWallet::HDWallet
            ((HDWallet *)
             &copy_seed.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::ByteData((ByteData *)&__range1);
  __end1 = std::vector<Bip39TestVector,_std::allocator<Bip39TestVector>_>::begin
                     (&bip39_test_vectors);
  test_vector.seed.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<Bip39TestVector,_std::allocator<Bip39TestVector>_>::end
                          (&bip39_test_vectors);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Bip39TestVector_*,_std::vector<Bip39TestVector,_std::allocator<Bip39TestVector>_>_>
                                     *)&test_vector.seed.data_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)
  {
    pBVar2 = __gnu_cxx::
             __normal_iterator<const_Bip39TestVector_*,_std::vector<Bip39TestVector,_std::allocator<Bip39TestVector>_>_>
             ::operator*(&__end1);
    Bip39TestVector::Bip39TestVector((Bip39TestVector *)local_110,pBVar2);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_140,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&test_vector.entropy.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::string((string *)&local_160,(string *)&test_passphrase_abi_cxx11_);
        cfd::core::HDWallet::HDWallet(&local_128,&local_140,&local_160,false);
        cfd::core::HDWallet::operator=
                  ((HDWallet *)
                   &copy_wallet.seed_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_128);
        cfd::core::HDWallet::~HDWallet(&local_128);
        std::__cxx11::string::~string((string *)&local_160);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_140);
      }
    }
    else {
      testing::Message::Message(local_170);
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                 ,0xc0,
                 "Expected: hd_wallet = HDWallet(test_vector.mnemonic, test_passphrase) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=(&local_178,local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      testing::Message::~Message(local_170);
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::HDWallet::GetSeed
                  (&local_190,
                   (HDWallet *)
                   &copy_wallet.seed_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        cfd::core::ByteData::operator=((ByteData *)local_58,&local_190);
        cfd::core::ByteData::~ByteData(&local_190);
      }
    }
    else {
      testing::Message::Message(&local_198);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                 ,0xc1,
                 "Expected: actual_seed = hd_wallet.GetSeed() doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      testing::Message::~Message(&local_198);
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::HDWallet::ConvertMnemonicToEntropy
                  (&local_1b8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&test_vector.entropy.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,&language_abi_cxx11_);
        cfd::core::ByteData::operator=
                  ((ByteData *)
                   &actual_mnemonic.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1b8);
        cfd::core::ByteData::~ByteData(&local_1b8);
      }
    }
    else {
      testing::Message::Message(&local_1c0);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                 ,0xc2,
                 "Expected: actual_entropy = HDWallet::ConvertMnemonicToEntropy(test_vector.mnemonic, language) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1c8);
      testing::Message::~Message(&local_1c0);
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::HDWallet::ConvertEntropyToMnemonic
                  (&local_1e0,(ByteData *)local_110,&language_abi_cxx11_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&actual_seed.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&local_1e0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1e0);
      }
    }
    else {
      testing::Message::Message(&local_1e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                 ,0xc3,
                 "Expected: actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(test_vector.entropy, language) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      testing::Message::~Message(&local_1e8);
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        hd_wallet.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ =
             cfd::core::HDWallet::CheckValidMnemonic
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&test_vector.entropy.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&language_abi_cxx11_);
      }
    }
    else {
      testing::Message::Message(&local_1f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                 ,0xc4,
                 "Expected: actual_is_valid = HDWallet::CheckValidMnemonic(test_vector.mnemonic, language) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_1f8);
    }
    local_211 = cfd::core::ByteData::Equals
                          ((ByteData *)
                           &actual_mnemonic.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)local_110
                          );
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_210,&local_211,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_210,
                 (AssertionResult *)"actual_entropy.Equals(test_vector.entropy)","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                 ,0xc5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_220);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    testing::internal::EqHelper<false>::
    Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((EqHelper<false> *)local_258,"actual_mnemonic","test_vector.mnemonic",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&actual_seed.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&test_vector.entropy.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                 ,0xc6,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_260);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_260);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    local_279 = cfd::core::ByteData::Equals
                          ((ByteData *)local_58,
                           (ByteData *)
                           &test_vector.mnemonic.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_278,&local_279,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
    if (!bVar1) {
      testing::Message::Message(&local_288);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_278,
                 (AssertionResult *)"actual_seed.Equals(test_vector.seed)","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_290,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                 ,199,pcVar3);
      testing::internal::AssertHelper::operator=(&local_290,&local_288);
      testing::internal::AssertHelper::~AssertHelper(&local_290);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_288);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_2c0,
               (bool *)((long)&hd_wallet.seed_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 3),(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
    if (!bVar1) {
      testing::Message::Message(&local_2c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2f0,(internal *)local_2c0,(AssertionResult *)"actual_is_valid","false",
                 "true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                 ,200,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      testing::Message::~Message(&local_2c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
    cfd::core::HDWallet::HDWallet(&local_308,(ByteData *)local_58);
    cfd::core::HDWallet::operator=
              ((HDWallet *)
               &copy_seed.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_308);
    cfd::core::HDWallet::~HDWallet(&local_308);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::HDWallet::GetSeed
                  (&local_320,
                   (HDWallet *)
                   &copy_seed.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        cfd::core::ByteData::operator=((ByteData *)&__range1,&local_320);
        cfd::core::ByteData::~ByteData(&local_320);
      }
    }
    else {
      testing::Message::Message(&local_328);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                 ,0xcb,
                 "Expected: copy_seed = copy_wallet.GetSeed() doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_328);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
      testing::Message::~Message(&local_328);
    }
    local_341 = cfd::core::ByteData::Equals
                          ((ByteData *)&__range1,
                           (ByteData *)
                           &test_vector.mnemonic.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_340,&local_341,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
    if (!bVar1) {
      testing::Message::Message(&local_350);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_378,(internal *)local_340,
                 (AssertionResult *)"copy_seed.Equals(test_vector.seed)","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_358,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                 ,0xcc,pcVar3);
      testing::internal::AssertHelper::operator=(&local_358,&local_350);
      testing::internal::AssertHelper::~AssertHelper(&local_358);
      std::__cxx11::string::~string((string *)&local_378);
      testing::Message::~Message(&local_350);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
    Bip39TestVector::~Bip39TestVector((Bip39TestVector *)local_110);
    __gnu_cxx::
    __normal_iterator<const_Bip39TestVector_*,_std::vector<Bip39TestVector,_std::allocator<Bip39TestVector>_>_>
    ::operator++(&__end1);
  }
  cfd::core::ByteData::~ByteData((ByteData *)&__range1);
  cfd::core::HDWallet::~HDWallet
            ((HDWallet *)
             &copy_seed.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::HDWallet::~HDWallet
            ((HDWallet *)
             &copy_wallet.seed_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData((ByteData *)local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&actual_seed.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &actual_mnemonic.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(HDWallet, ConvertTest) {
  ByteData actual_entropy;
  std::vector<std::string> actual_mnemonic;
  ByteData actual_seed;
  bool actual_is_valid;
  HDWallet hd_wallet;

  HDWallet copy_wallet;
  ByteData copy_seed;
  for (Bip39TestVector test_vector : bip39_test_vectors) {
    EXPECT_NO_THROW(hd_wallet = HDWallet(test_vector.mnemonic, test_passphrase));
    EXPECT_NO_THROW(actual_seed = hd_wallet.GetSeed());
    EXPECT_NO_THROW(actual_entropy = HDWallet::ConvertMnemonicToEntropy(test_vector.mnemonic, language));
    EXPECT_NO_THROW(actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(test_vector.entropy, language));
    EXPECT_NO_THROW(actual_is_valid = HDWallet::CheckValidMnemonic(test_vector.mnemonic, language));
    EXPECT_TRUE(actual_entropy.Equals(test_vector.entropy));
    EXPECT_EQ(actual_mnemonic, test_vector.mnemonic);
    EXPECT_TRUE(actual_seed.Equals(test_vector.seed));
    EXPECT_TRUE(actual_is_valid);

    copy_wallet = HDWallet(actual_seed);
    EXPECT_NO_THROW(copy_seed = copy_wallet.GetSeed());
    EXPECT_TRUE(copy_seed.Equals(test_vector.seed));
  }
}